

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O2

ssize_t __thiscall pybind11::array::size(array *this)

{
  PyObject *pPVar1;
  ssize_t sVar2;
  long lVar3;
  
  pPVar1 = (this->super_buffer).super_object.super_handle.m_ptr;
  sVar2 = 1;
  for (lVar3 = 0; (long)*(int *)&pPVar1[1].ob_type * 8 != lVar3; lVar3 = lVar3 + 8) {
    sVar2 = sVar2 * *(long *)(pPVar1[2].ob_refcnt + lVar3);
  }
  return sVar2;
}

Assistant:

const ssize_t *shape() const { return detail::array_proxy(m_ptr)->dimensions; }